

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

void __thiscall UdpSocketImpl::~UdpSocketImpl(UdpSocketImpl *this)

{
  int __fd;
  bool bVar1;
  
  (this->super_BaseSocketImpl)._vptr_BaseSocketImpl = (_func_int **)&PTR__UdpSocketImpl_001465b0;
  (this->super_BaseSocketImpl).m_bStop = true;
  bVar1 = std::mutex::try_lock(&this->m_mxWrite);
  this->m_bCloseReq = true;
  LOCK();
  (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  std::condition_variable::notify_all();
  if (bVar1) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mxWrite);
  }
  __fd = (this->super_BaseSocketImpl).m_fSock;
  if (__fd != -1) {
    close(__fd);
    if ((this->super_BaseSocketImpl).m_fClosingParam.super__Function_base._M_manager ==
        (_Manager_type)0x0) {
      if ((this->super_BaseSocketImpl).m_fClosing.super__Function_base._M_manager !=
          (_Manager_type)0x0) {
        std::function<void_(BaseSocket_*)>::operator()
                  (&(this->super_BaseSocketImpl).m_fClosing,(this->super_BaseSocketImpl).m_pBkRef);
      }
    }
    else {
      std::function<void_(BaseSocket_*,_void_*)>::operator()
                (&(this->super_BaseSocketImpl).m_fClosingParam,(this->super_BaseSocketImpl).m_pBkRef
                 ,(this->super_BaseSocketImpl).m_pvUserData);
    }
  }
  std::_Function_base::~_Function_base(&(this->m_fBytesReceivedParam).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_fBytesReceived).super__Function_base);
  std::condition_variable::~condition_variable(&this->m_cv);
  std::
  deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~deque(&this->m_quOutData);
  std::_Function_base::~_Function_base(&(this->m_fnSslEncode).super__Function_base);
  std::
  deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~deque(&this->m_quInData);
  std::_Function_base::~_Function_base(&(this->m_fnSslDecode).super__Function_base);
  BaseSocketImpl::~BaseSocketImpl(&this->super_BaseSocketImpl);
  return;
}

Assistant:

UdpSocketImpl::~UdpSocketImpl()
{
    m_bStop = true; // Stops the listening thread
    const bool bIsLocked = m_mxWrite.try_lock();
    m_bCloseReq = true;
    m_atOutBytes = 0;
    m_cv.notify_all();
    if (bIsLocked == true)
        m_mxWrite.unlock();

    if (m_fSock != INVALID_SOCKET)
    {
        ::closesocket(m_fSock);

        if (m_fClosingParam)
            m_fClosingParam(m_pBkRef, m_pvUserData);
        else if (m_fClosing)
            m_fClosing(m_pBkRef);
    }
}